

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O2

void __thiscall cpp_mediator_send_receive2_Test::TestBody(cpp_mediator_send_receive2_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  response_type actual;
  
  actual = 1000;
  local_30.ptr_._0_4_ = 1000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1000","actual",(int *)&local_30,&actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
               ,0x92,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cpp_mediator, send_receive2) {
  SendForWithArgs(b, 1000);
  ASSERT_EQ(1000, actual);
}